

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

unique_ptr<Expression,_std::default_delete<Expression>_> __thiscall
Parser::parseParenthesisExpression(Parser *this)

{
  TokenType TVar1;
  undefined8 extraout_RAX;
  pointer *__ptr;
  Parser *in_RSI;
  Parser *this_00;
  undefined1 local_38 [16];
  undefined8 local_28;
  
  this_00 = (Parser *)local_38;
  nextToken(in_RSI);
  parseExpression(this);
  TVar1 = Token::type(&in_RSI->mCurrentToken);
  if (TVar1 == RIGHT_PARENTHESIS) {
    nextToken(in_RSI);
    return (__uniq_ptr_data<Expression,_std::default_delete<Expression>,_true,_true>)
           (__uniq_ptr_data<Expression,_std::default_delete<Expression>,_true,_true>)this;
  }
  local_38._0_8_ = (CalculationEngine *)&stack0xffffffffffffffd8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"Expected \').\'","");
  parseError(this_00,(string *)local_38);
  if ((CalculationEngine *)local_38._0_8_ != (CalculationEngine *)&stack0xffffffffffffffd8) {
    operator_delete((void *)local_38._0_8_,(ulong)(local_28 + 1));
  }
  if (this->mCalcEngine != (CalculationEngine *)0x0) {
    (**(code **)(*(long *)this->mCalcEngine + 8))();
  }
  this->mCalcEngine = (CalculationEngine *)0x0;
  _Unwind_Resume(extraout_RAX);
}

Assistant:

std::unique_ptr<Expression> Parser::parseParenthesisExpression() {
	nextToken(); //Eat the '('
	auto expr = parseExpression();

	if (mCurrentToken.type() != TokenType::RIGHT_PARENTHESIS) {
		parseError("Expected ').'");
	}

	nextToken(); //Eat the ')'
	return expr;
}